

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O0

deUint32 __thiscall
sglr::ReferenceContext::checkFramebufferStatus(ReferenceContext *this,deUint32 target)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  void *pvVar4;
  bool bVar5;
  deBool dVar6;
  CubeFace face_00;
  Attachment *pAVar7;
  TestError *pTVar8;
  ConstPixelBufferAccess *pCVar9;
  TextureFormat *pTVar10;
  Renderbuffer *this_00;
  Framebuffer *local_e0;
  Renderbuffer *renderbuffer;
  TextureCubeArray *texCubeArr;
  Texture3D *tex3D;
  Texture2DArray *tex2DArr;
  CubeFace face;
  TextureCube *texCube;
  Texture2D *tex2D;
  undefined1 local_80 [8];
  ConstPixelBufferAccess level;
  Texture *texture;
  TextureFormat attachmentFormat;
  int attachmentHeight;
  int attachmentWidth;
  Attachment *attachment;
  int point;
  bool dimensionsOk;
  bool attachmentComplete;
  ChannelType CStack_2c;
  bool hasAttachment;
  int height;
  int width;
  Framebuffer *framebufferBinding;
  deUint32 target_local;
  ReferenceContext *this_local;
  
  do {
    if (((target != 0x8d40) && (target != 0x8ca9)) && (target != 0x8ca8)) {
      setError(this,0x500);
      return 0;
    }
    dVar6 = ::deGetFalse();
  } while (dVar6 != 0);
  if ((target == 0x8d40) || (target == 0x8ca9)) {
    local_e0 = this->m_drawFramebufferBinding;
  }
  else {
    local_e0 = this->m_readFramebufferBinding;
  }
  if (local_e0 == (Framebuffer *)0x0) {
    this_local._4_4_ = 0x8cd5;
  }
  else {
    CStack_2c = ~SNORM_INT8;
    point = -1;
    bVar1 = false;
    bVar2 = true;
    bVar3 = true;
    for (attachment._0_4_ = ATTACHMENTPOINT_COLOR0; (int)(AttachmentPoint)attachment < 3;
        attachment._0_4_ = (AttachmentPoint)attachment + ATTACHMENTPOINT_DEPTH) {
      pAVar7 = rc::Framebuffer::getAttachment(local_e0,(AttachmentPoint)attachment);
      attachmentFormat.type = SNORM_INT8;
      attachmentFormat.order = R;
      tcu::TextureFormat::TextureFormat((TextureFormat *)&texture);
      if (pAVar7->type == ATTACHMENTTYPE_TEXTURE) {
        level.m_data = rc::ObjectManager<sglr::rc::Texture>::find(&this->m_textures,pAVar7->name);
        tcu::ConstPixelBufferAccess::ConstPixelBufferAccess((ConstPixelBufferAccess *)local_80);
        do {
          dVar6 = ::deGetFalse();
          if ((dVar6 != 0) || (level.m_data == (void *)0x0)) {
            pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (pTVar8,(char *)0x0,"texture",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/simplereference/sglrReferenceContext.cpp"
                       ,0x885);
            __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
          }
          dVar6 = ::deGetFalse();
          pvVar4 = level.m_data;
        } while (dVar6 != 0);
        if (pAVar7->texTarget == TEXTARGET_2D) {
          bVar5 = rc::Texture2D::hasLevel((Texture2D *)level.m_data,pAVar7->level);
          if (bVar5) {
            pCVar9 = rc::Texture2D::getLevel((Texture2D *)pvVar4,pAVar7->level);
            memcpy(local_80,pCVar9,0x28);
          }
        }
        else {
          dVar6 = deInRange32(pAVar7->texTarget,1,6);
          pvVar4 = level.m_data;
          if (dVar6 == 0) {
            if (pAVar7->texTarget == TEXTARGET_2D_ARRAY) {
              bVar5 = rc::Texture2DArray::hasLevel((Texture2DArray *)level.m_data,pAVar7->level);
              if (bVar5) {
                pCVar9 = rc::Texture2DArray::getLevel((Texture2DArray *)pvVar4,pAVar7->level);
                memcpy(local_80,pCVar9,0x28);
              }
            }
            else if (pAVar7->texTarget == TEXTARGET_3D) {
              bVar5 = rc::Texture3D::hasLevel((Texture3D *)level.m_data,pAVar7->level);
              if (bVar5) {
                pCVar9 = rc::Texture3D::getLevel((Texture3D *)pvVar4,pAVar7->level);
                memcpy(local_80,pCVar9,0x28);
              }
            }
            else {
              if (pAVar7->texTarget != TEXTARGET_CUBE_MAP_ARRAY) {
                pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
                tcu::TestError::TestError
                          (pTVar8,"Framebuffer attached to a texture but no valid target specified",
                           (char *)0x0,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/simplereference/sglrReferenceContext.cpp"
                           ,0x8b4);
                __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
              }
              bVar5 = rc::TextureCubeArray::hasLevel((TextureCubeArray *)level.m_data,pAVar7->level)
              ;
              if (bVar5) {
                pCVar9 = rc::TextureCubeArray::getLevel((TextureCubeArray *)pvVar4,pAVar7->level);
                memcpy(local_80,pCVar9,0x28);
              }
            }
          }
          else {
            face_00 = texTargetToFace(pAVar7->texTarget);
            do {
              dVar6 = ::deGetFalse();
              if ((dVar6 != 0) || (bVar5 = de::inBounds<int>(face_00,0,6), !bVar5)) {
                pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
                tcu::TestError::TestError
                          (pTVar8,(char *)0x0,"de::inBounds<int>(face, 0, tcu::CUBEFACE_LAST)",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/simplereference/sglrReferenceContext.cpp"
                           ,0x896);
                __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
              }
              dVar6 = ::deGetFalse();
            } while (dVar6 != 0);
            bVar5 = rc::TextureCube::hasFace((TextureCube *)pvVar4,pAVar7->level,face_00);
            if (bVar5) {
              pCVar9 = rc::TextureCube::getFace((TextureCube *)pvVar4,pAVar7->level,face_00);
              memcpy(local_80,pCVar9,0x28);
            }
          }
        }
        attachmentFormat.type =
             tcu::ConstPixelBufferAccess::getWidth((ConstPixelBufferAccess *)local_80);
        attachmentFormat.order =
             tcu::ConstPixelBufferAccess::getHeight((ConstPixelBufferAccess *)local_80);
        pTVar10 = tcu::ConstPixelBufferAccess::getFormat((ConstPixelBufferAccess *)local_80);
        texture = *(Texture **)pTVar10;
LAB_00cf387d:
        if (((bVar1) || ((int)attachmentFormat.type < 1)) || ((int)attachmentFormat.order < 1)) {
          if ((attachmentFormat.type != CStack_2c) || (attachmentFormat.order != point)) {
            bVar3 = false;
          }
        }
        else {
          CStack_2c = attachmentFormat.type;
          point = attachmentFormat.order;
          bVar1 = true;
        }
        switch((ulong)texture & 0xffffffff) {
        case 0:
        case 5:
        case 7:
        case 8:
        case 0xe:
        case 0xf:
          if ((AttachmentPoint)attachment != ATTACHMENTPOINT_COLOR0) {
            bVar2 = false;
          }
          break;
        default:
          pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar8,"Unsupported attachment channel order",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/simplereference/sglrReferenceContext.cpp"
                     ,0x8f0);
          __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
        case 0x12:
          if ((AttachmentPoint)attachment != ATTACHMENTPOINT_DEPTH) {
            bVar2 = false;
          }
          break;
        case 0x13:
          if ((AttachmentPoint)attachment != ATTACHMENTPOINT_STENCIL) {
            bVar2 = false;
          }
          break;
        case 0x14:
          if (((AttachmentPoint)attachment != ATTACHMENTPOINT_DEPTH) &&
             ((AttachmentPoint)attachment != ATTACHMENTPOINT_STENCIL)) {
            bVar2 = false;
          }
        }
      }
      else {
        if (pAVar7->type == ATTACHMENTTYPE_RENDERBUFFER) {
          this_00 = rc::ObjectManager<sglr::rc::Renderbuffer>::find
                              (&this->m_renderbuffers,pAVar7->name);
          do {
            dVar6 = ::deGetFalse();
            if ((dVar6 != 0) || (this_00 == (Renderbuffer *)0x0)) {
              pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
              tcu::TestError::TestError
                        (pTVar8,(char *)0x0,"renderbuffer",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/simplereference/sglrReferenceContext.cpp"
                         ,0x8bd);
              __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
            }
            dVar6 = ::deGetFalse();
          } while (dVar6 != 0);
          attachmentFormat.type = rc::Renderbuffer::getWidth(this_00);
          attachmentFormat.order = rc::Renderbuffer::getHeight(this_00);
          texture = (Texture *)rc::Renderbuffer::getFormat(this_00);
          goto LAB_00cf387d;
        }
        do {
          dVar6 = ::deGetFalse();
          if ((dVar6 != 0) || (pAVar7->type != ATTACHMENTTYPE_LAST)) {
            pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (pTVar8,(char *)0x0,"attachment.type == Framebuffer::ATTACHMENTTYPE_LAST",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/simplereference/sglrReferenceContext.cpp"
                       ,0x8c5);
            __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
          }
          dVar6 = ::deGetFalse();
        } while (dVar6 != 0);
      }
    }
    if (bVar2) {
      if (bVar1) {
        if (bVar3) {
          this_local._4_4_ = 0x8cd5;
        }
        else {
          this_local._4_4_ = 0x8cd9;
        }
      }
      else {
        this_local._4_4_ = 0x8cd7;
      }
    }
    else {
      this_local._4_4_ = 0x8cd6;
    }
  }
  return this_local._4_4_;
}

Assistant:

deUint32 ReferenceContext::checkFramebufferStatus (deUint32 target)
{
	RC_IF_ERROR(target != GL_FRAMEBUFFER		&&
				target != GL_DRAW_FRAMEBUFFER	&&
				target != GL_READ_FRAMEBUFFER, GL_INVALID_ENUM, 0);

	// Select binding point.
	rc::Framebuffer* framebufferBinding = (target == GL_FRAMEBUFFER || target == GL_DRAW_FRAMEBUFFER) ? m_drawFramebufferBinding : m_readFramebufferBinding;

	// Default framebuffer is always complete.
	if (!framebufferBinding)
		return GL_FRAMEBUFFER_COMPLETE;

	int		width				= -1;
	int		height				= -1;
	bool	hasAttachment		= false;
	bool	attachmentComplete	= true;
	bool	dimensionsOk		= true;

	for (int point = 0; point < Framebuffer::ATTACHMENTPOINT_LAST; point++)
	{
		const Framebuffer::Attachment&	attachment			= framebufferBinding->getAttachment((Framebuffer::AttachmentPoint)point);
		int								attachmentWidth		= 0;
		int								attachmentHeight	= 0;
		tcu::TextureFormat				attachmentFormat;

		if (attachment.type == Framebuffer::ATTACHMENTTYPE_TEXTURE)
		{
			const Texture*					texture	= m_textures.find(attachment.name);
			tcu::ConstPixelBufferAccess		level;
			TCU_CHECK(texture);

			if (attachment.texTarget == Framebuffer::TEXTARGET_2D)
			{
				DE_ASSERT(texture->getType() == Texture::TYPE_2D);
				const Texture2D* tex2D = static_cast<const Texture2D*>(texture);

				if (tex2D->hasLevel(attachment.level))
					level = tex2D->getLevel(attachment.level);
			}
			else if (deInRange32(attachment.texTarget, Framebuffer::TEXTARGET_CUBE_MAP_POSITIVE_X,
													   Framebuffer::TEXTARGET_CUBE_MAP_NEGATIVE_Z))
			{
				DE_ASSERT(texture->getType() == Texture::TYPE_CUBE_MAP);

				const TextureCube*	texCube	= static_cast<const TextureCube*>(texture);
				const tcu::CubeFace	face	= texTargetToFace(attachment.texTarget);
				TCU_CHECK(de::inBounds<int>(face, 0, tcu::CUBEFACE_LAST));

				if (texCube->hasFace(attachment.level, face))
					level = texCube->getFace(attachment.level, face);
			}
			else if (attachment.texTarget == Framebuffer::TEXTARGET_2D_ARRAY)
			{
				DE_ASSERT(texture->getType() == Texture::TYPE_2D_ARRAY);
				const Texture2DArray* tex2DArr = static_cast<const Texture2DArray*>(texture);

				if (tex2DArr->hasLevel(attachment.level))
					level = tex2DArr->getLevel(attachment.level); // \note Slice doesn't matter here.
			}
			else if (attachment.texTarget == Framebuffer::TEXTARGET_3D)
			{
				DE_ASSERT(texture->getType() == Texture::TYPE_3D);
				const Texture3D* tex3D = static_cast<const Texture3D*>(texture);

				if (tex3D->hasLevel(attachment.level))
					level = tex3D->getLevel(attachment.level); // \note Slice doesn't matter here.
			}
			else if (attachment.texTarget == Framebuffer::TEXTARGET_CUBE_MAP_ARRAY)
			{
				DE_ASSERT(texture->getType() == Texture::TYPE_CUBE_MAP_ARRAY);
				const TextureCubeArray* texCubeArr = static_cast<const TextureCubeArray*>(texture);

				if (texCubeArr->hasLevel(attachment.level))
					level = texCubeArr->getLevel(attachment.level); // \note Slice doesn't matter here.
			}
			else
				TCU_FAIL("Framebuffer attached to a texture but no valid target specified");

			attachmentWidth		= level.getWidth();
			attachmentHeight	= level.getHeight();
			attachmentFormat	= level.getFormat();
		}
		else if (attachment.type == Framebuffer::ATTACHMENTTYPE_RENDERBUFFER)
		{
			const Renderbuffer* renderbuffer = m_renderbuffers.find(attachment.name);
			TCU_CHECK(renderbuffer);

			attachmentWidth		= renderbuffer->getWidth();
			attachmentHeight	= renderbuffer->getHeight();
			attachmentFormat	= renderbuffer->getFormat();
		}
		else
		{
			TCU_CHECK(attachment.type == Framebuffer::ATTACHMENTTYPE_LAST);
			continue; // Skip rest of checks.
		}

		if (!hasAttachment && attachmentWidth > 0 && attachmentHeight > 0)
		{
			width			= attachmentWidth;
			height			= attachmentHeight;
			hasAttachment	= true;
		}
		else if (attachmentWidth != width || attachmentHeight != height)
			dimensionsOk = false;

		// Validate attachment point compatibility.
		switch (attachmentFormat.order)
		{
			case TextureFormat::R:
			case TextureFormat::RG:
			case TextureFormat::RGB:
			case TextureFormat::RGBA:
			case TextureFormat::sRGB:
			case TextureFormat::sRGBA:
				if (point != Framebuffer::ATTACHMENTPOINT_COLOR0)
					attachmentComplete = false;
				break;

			case TextureFormat::D:
				if (point != Framebuffer::ATTACHMENTPOINT_DEPTH)
					attachmentComplete = false;
				break;

			case TextureFormat::S:
				if (point != Framebuffer::ATTACHMENTPOINT_STENCIL)
					attachmentComplete = false;
				break;

			case TextureFormat::DS:
				if (point != Framebuffer::ATTACHMENTPOINT_DEPTH &&
					point != Framebuffer::ATTACHMENTPOINT_STENCIL)
					attachmentComplete = false;
				break;

			default:
				TCU_FAIL("Unsupported attachment channel order");
		}
	}

	if (!attachmentComplete)
		return GL_FRAMEBUFFER_INCOMPLETE_ATTACHMENT;
	else if (!hasAttachment)
		return GL_FRAMEBUFFER_INCOMPLETE_MISSING_ATTACHMENT;
	else if (!dimensionsOk)
		return GL_FRAMEBUFFER_INCOMPLETE_DIMENSIONS;
	else
		return GL_FRAMEBUFFER_COMPLETE;
}